

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O0

sstring_view<std::shared_ptr<const_char>_> * __thiscall
pstore::make_shared_sstring_view<char_const>
          (sstring_view<std::shared_ptr<const_char>_> *__return_storage_ptr__,pstore *this,
          shared_ptr<const_char> *ptr,size_t length)

{
  shared_ptr<const_char> local_30;
  shared_ptr<const_char> *local_20;
  size_t length_local;
  shared_ptr<const_char> *ptr_local;
  
  local_20 = ptr;
  length_local = (size_t)this;
  ptr_local = &__return_storage_ptr__->ptr_;
  std::shared_ptr<const_char>::shared_ptr(&local_30,(shared_ptr<const_char> *)this);
  sstring_view<std::shared_ptr<const_char>_>::sstring_view
            (__return_storage_ptr__,&local_30,(size_type)local_20);
  std::shared_ptr<const_char>::~shared_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline sstring_view<std::shared_ptr<ValueType>>
    make_shared_sstring_view (std::shared_ptr<ValueType> const & ptr, std::size_t length) {
        return {ptr, length};
    }